

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O0

void * OPENSSL_memdup(void *data,size_t size)

{
  void *ret;
  size_t size_local;
  void *data_local;
  
  if (size == 0) {
    data_local = (void *)0x0;
  }
  else {
    data_local = OPENSSL_malloc(size);
    if (data_local == (void *)0x0) {
      data_local = (void *)0x0;
    }
    else {
      OPENSSL_memcpy(data_local,data,size);
    }
  }
  return data_local;
}

Assistant:

void *OPENSSL_memdup(const void *data, size_t size) {
  if (size == 0) {
    return NULL;
  }

  void *ret = OPENSSL_malloc(size);
  if (ret == NULL) {
    return NULL;
  }

  OPENSSL_memcpy(ret, data, size);
  return ret;
}